

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

bool TdokuConstrain(bool pencilmark,char *puzzle)

{
  int index;
  char cVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  ushort uVar5;
  size_t sVar6;
  uint uVar7;
  size_t limit;
  int box_idx;
  State *this;
  undefined7 in_register_00000039;
  uint uVar8;
  uint *puVar9;
  vector<int,_std::allocator<int>_> permutation;
  Cells16 restrict;
  State state;
  State test_state;
  _Vector_base<int,_std::allocator<int>_> local_638;
  Bitvec16x16 local_620;
  State local_600;
  State local_420 [2];
  
  anon_unknown.dwarf_156bd::State::State(&local_600);
  if ((int)CONCAT71(in_register_00000039,pencilmark) == 0) {
    anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle,&local_600);
  }
  else {
    anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle,&local_600);
  }
  Util::Permutation((vector<int,_std::allocator<int>_> *)&local_638,
                    (Util *)((anonymous_namespace)::generator + 0x220),0x2d9);
  for (puVar9 = (uint *)local_638._M_impl.super__Vector_impl_data._M_start;
      puVar9 != (uint *)local_638._M_impl.super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
    uVar2 = *puVar9;
    uVar8 = (uint)((long)(int)uVar2 / 9);
    if (pencilmark) {
      if (puzzle[(int)uVar2] != '.') {
LAB_001060b1:
        cVar4 = (char)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 |
                             (long)(int)uVar2 / 9 & 0xffffffffU) % 9);
        box_idx = (int)(cVar4 / '\x03') + ((int)uVar2 / 0xf3) * 3;
        index = (int)(cVar4 % '\x03') +
                (int)((long)((ulong)(uint)((int)((long)(int)uVar2 / 0x51) >> 0x1f) << 0x20 |
                            (long)(int)uVar2 / 0x51 & 0xffffffffU) % 3) * 4;
        uVar5 = Bitvec16x16::Extract(&local_600.boxen[box_idx].cells,index);
        this = local_420;
        uVar7 = 1 << uVar2 % 9;
        if ((uVar7 != uVar5) && ((uVar7 & uVar5) != 0)) {
          local_620.vec[0] = local_600.boxen[box_idx].cells.vec[0];
          local_620.vec[1] = local_600.boxen[box_idx].cells.vec[1];
          local_620.vec[2] = local_600.boxen[box_idx].cells.vec[2];
          local_620.vec[3] = local_600.boxen[box_idx].cells.vec[3];
          if (!pencilmark) {
            uVar5 = 0;
          }
          Bitvec16x16::Insert(&local_620,index,uVar5 ^ (ushort)uVar7);
          anon_unknown.dwarf_156bd::State::State(this,&local_600);
          bVar3 = anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::BoxRestrict<0>
                            (this,box_idx,&local_620);
          if (bVar3) {
            cVar4 = (char)((int)uVar2 % 9) + '1';
            if (pencilmark) {
              uVar8 = uVar2;
            }
            cVar1 = puzzle[(int)uVar8];
            if (pencilmark) {
              cVar4 = '.';
            }
            puzzle[(int)uVar8] = cVar4;
            anon_unknown.dwarf_156bd::State::State(local_420 + 1,this);
            sVar6 = anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::
                    SafeCountSolutionsConsistentWithPartialAssignment
                              ((SolverDpllTriadSimd<0> *)(local_420 + 1),this,limit);
            if (sVar6 == 0) {
              puzzle[(int)uVar8] = cVar1;
            }
            else {
              if (sVar6 == 1) break;
              memcpy(&local_600,local_420,0x1e0);
            }
          }
        }
      }
    }
    else if (puzzle[(int)uVar8] == '.') goto LAB_001060b1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_638);
  return puVar9 != (uint *)local_638._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool TdokuConstrain(bool pencilmark, char *puzzle) {
    return generator.Constrain(pencilmark, puzzle);
}